

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionhandler.c
# Opt level: O3

OPTIONHANDLER_RESULT OptionHandler_FeedOptions(OPTIONHANDLER_HANDLE handle,void *destinationHandle)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  size_t sVar3;
  undefined8 *puVar4;
  OPTIONHANDLER_RESULT OVar5;
  size_t index;
  size_t sVar6;
  
  if (handle == (OPTIONHANDLER_HANDLE)0x0 || destinationHandle == (void *)0x0) {
    p_Var2 = xlogging_get_log_function();
    OVar5 = OPTIONHANDLER_INVALIDARG;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/optionhandler.c"
                ,"OptionHandler_FeedOptions",0xe9,1,
                "invalid arguments OPTIONHANDLER_HANDLE handle=%p, void* destinationHandle=%p",
                handle,destinationHandle);
    }
  }
  else {
    sVar3 = VECTOR_size(handle->storage);
    index = 0;
    sVar6 = index;
    if (sVar3 != 0) {
      do {
        puVar4 = (undefined8 *)VECTOR_element(handle->storage,index);
        if ((puVar4 != (undefined8 *)0x0) &&
           (iVar1 = (*handle->setOption)(destinationHandle,(char *)*puVar4,(void *)puVar4[1]),
           iVar1 != 0)) {
          p_Var2 = xlogging_get_log_function();
          sVar6 = index;
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/optionhandler.c"
                      ,"OptionHandler_FeedOptions",0xf8,1,
                      "failure while trying to SetOption with option %s",*puVar4);
          }
          break;
        }
        index = index + 1;
        sVar6 = sVar3;
      } while (sVar3 != index);
    }
    OVar5 = (OPTIONHANDLER_RESULT)(sVar6 != sVar3);
  }
  return OVar5;
}

Assistant:

OPTIONHANDLER_RESULT OptionHandler_FeedOptions(OPTIONHANDLER_HANDLE handle, void* destinationHandle)
{
    OPTIONHANDLER_RESULT result;
    /*Codes_SRS_OPTIONHANDLER_02_010: [ OptionHandler_FeedOptions shall fail and return OPTIONHANDLER_INVALIDARG if any argument is NULL. ]*/
    if (
        (handle == NULL) ||
        (destinationHandle == NULL)
        )
    {
        LogError("invalid arguments OPTIONHANDLER_HANDLE handle=%p, void* destinationHandle=%p", handle, destinationHandle);
        result = OPTIONHANDLER_INVALIDARG;
    }
    else
    {
        /*Codes_SRS_OPTIONHANDLER_02_011: [ Otherwise, OptionHandler_FeedOptions shall use VECTOR's iteration mechanisms to retrieve pairs of name, value (const char* and void*). ]*/
        size_t nOptions = VECTOR_size(handle->storage), i;
        for (i = 0;i < nOptions;i++)
        {
            OPTION* option = (OPTION*)VECTOR_element(handle->storage, i);
            if (option != NULL)
            {
                /*Codes_SRS_OPTIONHANDLER_02_012: [ OptionHandler_FeedOptions shall call for every pair of name,value setOption passing destinationHandle, name and value. ]*/
                if (handle->setOption(destinationHandle, option->name, option->storage) != 0)
                {
                    LogError("failure while trying to SetOption with option %s", option->name);
                    break;
                }
            }
        }

        if (i == nOptions)
        {
            /*Codes_SRS_OPTIONHANDLER_02_014: [ Otherwise, OptionHandler_FeedOptions shall fail and return OPTIONHANDLER_ERROR. ]*/
            result = OPTIONHANDLER_OK;
        }
        else
        {
            /*Codes_SRS_OPTIONHANDLER_02_013: [ If all the operations succeed then OptionHandler_FeedOptions shall succeed and return OPTIONHANDLER_OK. ]*/
            result = OPTIONHANDLER_ERROR;
        }
    }
    return result;
}